

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

void upb_MtDecoder_PushItem(upb_MtDecoder *d,upb_LayoutItem item)

{
  size_t sVar1;
  upb_LayoutItem *puVar2;
  ulong uVar3;
  upb_LayoutItem *puVar4;
  undefined8 uVar5;
  ulong uVar6;
  
  uVar5 = item._0_8_;
  sVar1 = (d->vec).size;
  if (sVar1 == (d->vec).capacity) {
    uVar3 = sVar1 * 2;
    uVar6 = 8;
    if (8 < uVar3) {
      uVar6 = uVar3;
    }
    puVar4 = (upb_LayoutItem *)realloc((d->vec).data,uVar6 * 0xc);
    (d->vec).data = puVar4;
    if (puVar4 == (upb_LayoutItem *)0x0) {
      upb_MdDecoder_ErrorJmp(&d->base,"Out of memory");
    }
    (d->vec).capacity = uVar6;
  }
  puVar2 = (d->vec).data;
  sVar1 = (d->vec).size;
  (d->vec).size = sVar1 + 1;
  puVar4 = puVar2 + sVar1;
  puVar4->field_index = (short)uVar5;
  puVar4->offset = (short)((ulong)uVar5 >> 0x10);
  puVar4->rep = (int)((ulong)uVar5 >> 0x20);
  puVar2[sVar1].type = item.type;
  return;
}

Assistant:

static void upb_MtDecoder_PushItem(upb_MtDecoder* d, upb_LayoutItem item) {
  if (d->vec.size == d->vec.capacity) {
    size_t new_cap = UPB_MAX(8, d->vec.size * 2);
    d->vec.data = realloc(d->vec.data, new_cap * sizeof(*d->vec.data));
    upb_MdDecoder_CheckOutOfMemory(&d->base, d->vec.data);
    d->vec.capacity = new_cap;
  }
  d->vec.data[d->vec.size++] = item;
}